

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O3

void Gia_WriteDotAig(Gia_Man_t *p,char *pFileName,Vec_Int_t *vBold,Vec_Int_t *vAdds,Vec_Int_t *vXors
                    ,Vec_Int_t *vMapAdds,Vec_Int_t *vMapXors,Vec_Int_t *vOrder)

{
  undefined1 *puVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  long lVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  Vec_Int_t *pVVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar12;
  uint uVar13;
  size_t __size;
  char *pcVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int k;
  long lVar18;
  long lVar19;
  
  iVar5 = Ree_ManCountFadds(vAdds);
  if ((p->vCis->nSize - p->nObjs) + p->vCos->nSize < -0x7d1) {
    fprintf(_stdout,"Cannot visualize AIG with more than %d nodes.\n",2000);
    return;
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    return;
  }
  if ((vBold != (Vec_Int_t *)0x0) && (0 < vBold->nSize)) {
    lVar7 = 0;
    do {
      iVar16 = vBold->pArray[lVar7];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_007bc552;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar16].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vBold->nSize);
  }
  uVar6 = p->nLevels;
  uVar10 = (ulong)uVar6;
  uVar13 = uVar6 + 1;
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    piVar2 = pVVar9->pArray;
    lVar7 = 0;
    do {
      iVar16 = piVar2[lVar7];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_007bc552;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->vLevels->nSize <= iVar16) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p->vLevels->pArray[iVar16] = uVar13;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar9->nSize);
  }
  fprintf(__stream,"# %s\n","AIG structure generated by GIA package");
  fputc(10,__stream);
  fwrite("digraph AIG {\n",0xe,1,__stream);
  fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
  fwrite("center = true;\n",0xf,1,__stream);
  fwrite("edge [dir = back];\n",0x13,1,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
  fwrite("  edge [style = invis];\n",0x18,1,__stream);
  fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
  fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
  if ((int)uVar6 < -1) {
    fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
  }
  else {
    uVar15 = uVar6 + 2;
    do {
      uVar15 = uVar15 - 1;
      fprintf(__stream,"  Level%d",(ulong)uVar15);
      fwrite(" [label = ",10,1,__stream);
      fputc(0x22,__stream);
      fputc(0x22,__stream);
      fwrite("];\n",3,1,__stream);
    } while (0 < (int)uVar15);
    fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
    uVar15 = uVar13;
    if (-2 < (int)uVar6) {
      do {
        fprintf(__stream,"  Level%d",(ulong)uVar15);
        if (uVar15 == 0) {
          fputc(0x3b,__stream);
          break;
        }
        fwrite(" ->",3,1,__stream);
        bVar4 = 0 < (int)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar4);
    }
  }
  fputc(10,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle1;\n",0xf,1,__stream);
  fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=20,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  fputs("AIG structure visualized by ABC",__stream);
  fwrite("\\n",2,1,__stream);
  fprintf(__stream,"Benchmark \\\"%s\\\". ","aig");
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle2;\n",0xf,1,__stream);
  fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=18,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  fprintf(__stream,
          "The AIG contains %d nodes, %d full-adders, and %d half-adders, and spans %d levels.",
          (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs),iVar5,
          (ulong)(uint)(vAdds->nSize / 6 - iVar5),uVar10);
  fwrite("\\n",2,1,__stream);
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fprintf(__stream,"  Level%d;\n",(ulong)uVar13);
  pVVar9 = p->vCos;
  if (pVVar9->nSize < 1) {
    bVar4 = true;
  }
  else {
    lVar7 = 0;
    bVar4 = false;
    do {
      uVar13 = pVVar9->pArray[lVar7];
      if (((long)(int)uVar13 < 0) || (p->nObjs <= (int)uVar13)) goto LAB_007bc552;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (uVar13 == (*(uint *)(p->pObjs + (int)uVar13) & 0x1fffffff)) {
        bVar4 = true;
      }
      fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar13);
      fprintf(__stream,", shape = %s","invtriangle");
      fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
      fwrite("];\n",3,1,__stream);
      lVar7 = lVar7 + 1;
      pVVar9 = p->vCos;
    } while (lVar7 < pVVar9->nSize);
    bVar4 = !bVar4;
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  if (0 < (int)uVar6) {
    do {
      fwrite("{\n",2,1,__stream);
      fwrite("  rank = same;\n",0xf,1,__stream);
      fprintf(__stream,"  Level%d;\n",uVar10);
      iVar5 = (int)uVar10;
      if (0 < vOrder->nSize) {
        lVar7 = 0;
        uVar12 = extraout_RDX;
        do {
          uVar6 = vOrder->pArray[lVar7];
          lVar17 = (long)(int)uVar6;
          if ((lVar17 < 0) || (p->nObjs <= (int)uVar6)) goto LAB_007bc552;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          pVVar9 = p->vLevels;
          Vec_IntFillExtra(pVVar9,uVar6 + 1,(int)uVar12);
          if (pVVar9->nSize <= (int)uVar6) goto LAB_007bc533;
          uVar12 = extraout_RDX_00;
          if (pVVar9->pArray[lVar17] == iVar5) {
            pGVar3 = pGVar3 + lVar17;
            uVar13 = (uint)*(undefined8 *)pGVar3;
            if ((uVar13 >> 0x1e & 1) == 0) {
              if (vMapAdds->nSize <= (int)uVar6) goto LAB_007bc533;
              uVar15 = vMapAdds->pArray[lVar17];
              if ((int)uVar15 < 0) goto LAB_007bb7b4;
              uVar6 = Gia_ShowAddOut(vAdds,vMapAdds,uVar6);
              iVar16 = uVar15 * 6;
              if ((vAdds->nSize <= iVar16 + 3) || ((uint)vAdds->nSize <= iVar16 + 4U))
              goto LAB_007bc533;
              fprintf(__stream,"  Node%d [label = \"%d_%d\"",(ulong)uVar6,
                      (ulong)(uint)vAdds->pArray[(ulong)uVar15 * 6 + 3],
                      (ulong)(uint)vAdds->pArray[iVar16 + 4U]);
              if (vAdds->nSize <= (int)(iVar16 + 2U)) goto LAB_007bc533;
              if (vAdds->pArray[iVar16 + 2U] == 0) {
                __size = 0x11;
                pcVar14 = ", shape = octagon";
              }
              else {
                __size = 0x17;
                pcVar14 = ", shape = doubleoctagon";
              }
            }
            else {
LAB_007bb7b4:
              if (vMapXors->nSize <= (int)uVar6) goto LAB_007bc533;
              if ((vMapXors->pArray[lVar17] < 0) &&
                 (((~uVar13 & 0x1fffffff) == 0 || (int)uVar13 < 0 ||
                  (((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff) <=
                   (uVar13 & 0x1fffffff))))) {
                pGVar8 = p->pObjs;
                if ((pGVar3 < pGVar8) || (pGVar8 + p->nObjs <= pGVar3)) goto LAB_007bc571;
                if ((p->pMuxes == (uint *)0x0) ||
                   (p->pMuxes[(int)((ulong)((long)pGVar3 - (long)pGVar8) >> 2) * -0x55555555] == 0))
                {
                  fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar6,(ulong)uVar6);
                  __size = 0x11;
                  pcVar14 = ", shape = ellipse";
                }
                else {
                  fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar6,(ulong)uVar6);
                  __size = 0x13;
                  pcVar14 = ", shape = trapezium";
                }
              }
              else {
                fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar6,(ulong)uVar6);
                __size = 0x16;
                pcVar14 = ", shape = doublecircle";
              }
            }
            fwrite(pcVar14,__size,1,__stream);
            if ((pGVar3->field_0x3 & 0x40) != 0) {
              fwrite(", style = filled",0x10,1,__stream);
            }
            fwrite("];\n",3,1,__stream);
            uVar12 = extraout_RDX_01;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < vOrder->nSize);
      }
      fputc(0x7d,__stream);
      fputc(10,__stream);
      fputc(10,__stream);
      uVar10 = (ulong)(iVar5 - 1);
    } while (1 < iVar5);
  }
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fprintf(__stream,"  Level%d;\n",0);
  if (!bVar4) {
    fprintf(__stream,"  Node%d [label = \"Const0\"",0);
    fwrite(", shape = ellipse",0x11,1,__stream);
    fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
    fwrite("];\n",3,1,__stream);
  }
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar7 = 0;
    do {
      uVar6 = pVVar9->pArray[lVar7];
      if (((int)uVar6 < 0) || (p->nObjs <= (int)uVar6)) goto LAB_007bc552;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar6);
      fprintf(__stream,", shape = %s","triangle");
      fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
      fwrite("];\n",3,1,__stream);
      lVar7 = lVar7 + 1;
      pVVar9 = p->vCis;
    } while (lVar7 < pVVar9->nSize);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
  pVVar9 = p->vCos;
  uVar10 = (ulong)(uint)pVVar9->nSize;
  if (0 < pVVar9->nSize) {
    lVar7 = 0;
    do {
      iVar5 = (int)uVar10;
      if ((pVVar9->pArray[lVar7] < 0) || (p->nObjs <= pVVar9->pArray[lVar7])) goto LAB_007bc552;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      fprintf(__stream,"title2 -> Node%d [style = invis];\n");
      lVar7 = lVar7 + 1;
      pVVar9 = p->vCos;
      iVar5 = pVVar9->nSize;
      uVar10 = (ulong)iVar5;
    } while (lVar7 < (long)uVar10);
    if (0 < iVar5) {
      uVar10 = 0xffffffff;
      lVar7 = 0;
      do {
        uVar6 = pVVar9->pArray[lVar7];
        if (((long)(int)uVar6 < 0) || (p->nObjs <= (int)uVar6)) goto LAB_007bc552;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar8 = pGVar3;
        if (lVar7 != 0) {
          fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar10,(ulong)uVar6);
          pGVar8 = p->pObjs;
        }
        pGVar3 = pGVar3 + (int)uVar6;
        if ((pGVar3 < pGVar8) || (pGVar8 + p->nObjs <= pGVar3)) goto LAB_007bc571;
        uVar10 = (ulong)(uint)((int)((ulong)((long)pGVar3 - (long)pGVar8) >> 2) * -0x55555555);
        lVar7 = lVar7 + 1;
        pVVar9 = p->vCos;
      } while (lVar7 < pVVar9->nSize);
    }
  }
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    uVar10 = 0xffffffff;
    lVar7 = 0;
    do {
      uVar6 = pVVar11->pArray[lVar7];
      if (((long)(int)uVar6 < 0) || (p->nObjs <= (int)uVar6)) goto LAB_007bc552;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar8 = pGVar3;
      if (lVar7 != 0) {
        fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar10,(ulong)uVar6);
        pGVar8 = p->pObjs;
      }
      pGVar3 = pGVar3 + (int)uVar6;
      if ((pGVar3 < pGVar8) || (pGVar8 + p->nObjs <= pGVar3)) goto LAB_007bc571;
      uVar10 = (ulong)(uint)((int)((ulong)((long)pGVar3 - (long)pGVar8) >> 2) * -0x55555555);
      lVar7 = lVar7 + 1;
      pVVar11 = p->vCis;
    } while (lVar7 < pVVar11->nSize);
    pVVar9 = p->vCos;
  }
  if (0 < pVVar9->nSize) {
    lVar7 = 0;
    do {
      uVar6 = pVVar9->pArray[lVar7];
      lVar17 = (long)(int)uVar6;
      if ((lVar17 < 0) || (p->nObjs <= (int)uVar6)) goto LAB_007bc552;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      fprintf(__stream,"Node%d",(ulong)uVar6);
      fwrite(" -> ",4,1,__stream);
      uVar6 = Gia_ShowAddOut(vAdds,vMapAdds,uVar6 - (*(uint *)(pGVar3 + lVar17) & 0x1fffffff));
      fprintf(__stream,"Node%d",(ulong)uVar6);
      fwrite(" [",2,1,__stream);
      pcVar14 = "dotted";
      if ((*(uint *)(pGVar3 + lVar17) >> 0x1d & 1) == 0) {
        pcVar14 = "solid";
      }
      fprintf(__stream,"style = %s",pcVar14);
      fputc(0x5d,__stream);
      fwrite(";\n",2,1,__stream);
      lVar7 = lVar7 + 1;
      pVVar9 = p->vCos;
    } while (lVar7 < pVVar9->nSize);
  }
  if (0 < vOrder->nSize) {
    lVar7 = 0;
    do {
      iVar5 = vOrder->pArray[lVar7];
      lVar17 = (long)iVar5;
      if ((lVar17 < 0) || (p->nObjs <= iVar5)) goto LAB_007bc552;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vMapAdds->nSize <= iVar5) {
LAB_007bc533:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vMapAdds->pArray[lVar17] < 0) {
        if (vMapXors->nSize <= iVar5) goto LAB_007bc533;
        if (vMapXors->pArray[lVar17] < 0) {
          pGVar3 = p->pObjs + lVar17;
          fprintf(__stream,"Node%d");
          fwrite(" -> ",4,1,__stream);
          uVar6 = Gia_ShowAddOut(vAdds,vMapAdds,iVar5 - (*(uint *)pGVar3 & 0x1fffffff));
          fprintf(__stream,"Node%d",(ulong)uVar6);
          fwrite(" [",2,1,__stream);
          pcVar14 = "dotted";
          if ((*(uint *)pGVar3 >> 0x1d & 1) == 0) {
            pcVar14 = "solid";
          }
          fprintf(__stream,"style = %s",pcVar14);
          fputc(0x5d,__stream);
          fwrite(";\n",2,1,__stream);
          if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
            fprintf(__stream,"Node%d");
            fwrite(" -> ",4,1,__stream);
            uVar6 = Gia_ShowAddOut(vAdds,vMapAdds,iVar5 - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff)
                                  );
            fprintf(__stream,"Node%d",(ulong)uVar6);
            fwrite(" [",2,1,__stream);
            pcVar14 = "dotted";
            if ((*(ulong *)pGVar3 >> 0x3d & 1) == 0) {
              pcVar14 = "solid";
            }
            fprintf(__stream,"style = %s",pcVar14);
            fputc(0x5d,__stream);
            fwrite(";\n",2,1,__stream);
            pGVar8 = p->pObjs;
            if ((pGVar3 < pGVar8) || (pGVar8 + p->nObjs <= pGVar3)) goto LAB_007bc571;
            if ((p->pMuxes != (uint *)0x0) &&
               (p->pMuxes[(int)((ulong)((long)pGVar3 - (long)pGVar8) >> 2) * -0x55555555] != 0)) {
              fprintf(__stream,"Node%d");
              fwrite(" -> ",4,1,__stream);
              uVar6 = 0xffffffff;
              if (p->pMuxes != (uint *)0x0) {
                uVar13 = p->pMuxes[lVar17];
                if (uVar13 != 0) {
                  if ((int)uVar13 < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  uVar6 = uVar13 >> 1;
                }
              }
              uVar6 = Gia_ShowAddOut(vAdds,vMapAdds,uVar6);
              fprintf(__stream,"Node%d",(ulong)uVar6);
              fwrite(" [",2,1,__stream);
              if (p->pMuxes == (uint *)0x0) {
LAB_007bc3f6:
                pcVar14 = "solid";
              }
              else {
                pGVar8 = p->pObjs;
                if ((pGVar3 < pGVar8) || (pGVar8 + p->nObjs <= pGVar3)) {
LAB_007bc571:
                  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                }
                uVar6 = p->pMuxes[(int)((ulong)((long)pGVar3 - (long)pGVar8) >> 2) * -0x55555555];
                if ((int)uVar6 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x130,"int Abc_LitIsCompl(int)");
                }
                pcVar14 = "dotted";
                if ((uVar6 & 1) == 0) goto LAB_007bc3f6;
              }
              fprintf(__stream,"style = %s",pcVar14);
              fputc(0x5d,__stream);
              fwrite(";\n",2,1,__stream);
            }
          }
        }
        else {
          uVar10 = (ulong)(uint)(vMapXors->pArray[lVar17] << 2);
          lVar19 = 3;
          do {
            uVar10 = uVar10 + 1;
            if (vXors->nSize <= (int)uVar10) goto LAB_007bc533;
            uVar6 = vXors->pArray[uVar10];
            if ((ulong)uVar6 != 0) {
              if (((int)uVar6 < 0) || (vMapXors->nSize <= (int)uVar6)) goto LAB_007bc533;
              iVar5 = vMapXors->pArray[uVar6];
              fprintf(__stream,"Node%d",lVar17);
              fwrite(" -> ",4,1,__stream);
              if (vXors->nSize <= (int)uVar10) goto LAB_007bc533;
              uVar6 = Gia_ShowAddOut(vAdds,vMapAdds,vXors->pArray[uVar10]);
              fprintf(__stream,"Node%d",(ulong)uVar6);
              fwrite(" [",2,1,__stream);
              pcVar14 = "solid";
              if (-1 < iVar5) {
                pcVar14 = "bold";
              }
              fprintf(__stream,"style = %s",pcVar14);
              fputc(0x5d,__stream);
              fwrite(";\n",2,1,__stream);
            }
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
        }
      }
      else {
        lVar17 = (ulong)(uint)vMapAdds->pArray[lVar17] * 6;
        lVar18 = 0;
        lVar19 = lVar17;
        do {
          iVar16 = (int)lVar17 + (int)lVar18;
          if (vAdds->nSize <= iVar16) goto LAB_007bc533;
          uVar6 = vAdds->pArray[lVar19];
          if ((ulong)uVar6 != 0) {
            if (((int)uVar6 < 0) || (vMapAdds->nSize <= (int)uVar6)) goto LAB_007bc533;
            uVar13 = vMapAdds->pArray[uVar6];
            pcVar14 = "solid";
            if (-1 < (int)uVar13) {
              if ((uint)vAdds->nSize <= uVar13 * 6 + 3) goto LAB_007bc533;
              pcVar14 = "solid";
              if (vAdds->pArray[(ulong)uVar13 * 6 + 3] == uVar6) {
                pcVar14 = "bold";
              }
            }
            uVar6 = Gia_ShowAddOut(vAdds,vMapAdds,iVar5);
            fprintf(__stream,"Node%d",(ulong)uVar6);
            fwrite(" -> ",4,1,__stream);
            if (vAdds->nSize <= iVar16) goto LAB_007bc533;
            uVar6 = Gia_ShowAddOut(vAdds,vMapAdds,vAdds->pArray[lVar19]);
            fprintf(__stream,"Node%d",(ulong)uVar6);
            fwrite(" [",2,1,__stream);
            fprintf(__stream,"style = %s",pcVar14);
            fputc(0x5d,__stream);
            fwrite(";\n",2,1,__stream);
          }
          lVar18 = lVar18 + 1;
          lVar19 = lVar19 + 1;
        } while (lVar18 != 3);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vOrder->nSize);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fclose(__stream);
  if ((vBold != (Vec_Int_t *)0x0) && (0 < vBold->nSize)) {
    lVar7 = 0;
    do {
      iVar5 = vBold->pArray[lVar7];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_007bc552:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar5].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vBold->nSize);
  }
  pVVar9 = p->vLevels;
  if (pVVar9 != (Vec_Int_t *)0x0) {
    if (pVVar9->pArray != (int *)0x0) {
      free(pVVar9->pArray);
      p->vLevels->pArray = (int *)0x0;
      pVVar9 = p->vLevels;
      if (pVVar9 == (Vec_Int_t *)0x0) {
        return;
      }
    }
    free(pVVar9);
    p->vLevels = (Vec_Int_t *)0x0;
  }
  return;
}

Assistant:

void Gia_WriteDotAig( Gia_Man_t * p, char * pFileName, Vec_Int_t * vBold, Vec_Int_t * vAdds, Vec_Int_t * vXors, Vec_Int_t * vMapAdds, Vec_Int_t * vMapXors, Vec_Int_t * vOrder )
{
    FILE * pFile;
    Gia_Obj_t * pNode;//, * pTemp, * pPrev;
    int LevelMax, Prev, Level, i;
    int fConstIsUsed = 0;
    int nFadds = Ree_ManCountFadds( vAdds );

    if ( Gia_ManAndNum(p) > NODE_MAX )
    {
        fprintf( stdout, "Cannot visualize AIG with more than %d nodes.\n", NODE_MAX );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 1;

    // compute levels
    LevelMax = 1 + p->nLevels;
    Gia_ManForEachCo( p, pNode, i )
        Vec_IntWriteEntry( p->vLevels, Gia_ObjId(p, pNode), LevelMax );

    // write the DOT header
    fprintf( pFile, "# %s\n",  "AIG structure generated by GIA package" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph AIG {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "AIG structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", "aig" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The AIG contains %d nodes, %d full-adders, and %d half-adders, and spans %d levels.", 
        Gia_ManAndNum(p), nFadds, Vec_IntSize(vAdds)/6-nFadds, LevelMax-1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( Gia_ObjFaninId0p(p, pNode) == 0 )
            fConstIsUsed = 1;
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "invtriangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Gia_ManForEachObjVec( vOrder, p, pNode, i )
        {
            int iNode = Gia_ObjId( p, pNode );
            if ( (int)Gia_ObjLevel(p, pNode) != Level )
                continue;
/*
            fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 
            if ( Gia_ObjIsXor(pNode) )
                fprintf( pFile, ", shape = doublecircle" );
            else if ( Gia_ObjIsMux(p, pNode) )
                fprintf( pFile, ", shape = trapezium" );
            else
                fprintf( pFile, ", shape = ellipse" );
*/
            if ( !pNode->fMark0 && Vec_IntEntry(vMapAdds, iNode) >= 0 )
            {
                int iBox = Vec_IntEntry(vMapAdds, iNode);
                fprintf( pFile, "  Node%d [label = \"%d_%d\"", Gia_ShowAddOut(vAdds, vMapAdds, iNode), Vec_IntEntry(vAdds, 6*iBox+3), Vec_IntEntry(vAdds, 6*iBox+4) ); 
                if ( Vec_IntEntry(vAdds, 6*iBox+2) == 0 )
                    fprintf( pFile, ", shape = octagon" );
                else 
                    fprintf( pFile, ", shape = doubleoctagon" );
            }
            else if ( Vec_IntEntry(vMapXors, iNode) >= 0 )
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = doublecircle" );
            }
            else if ( Gia_ObjIsXor(pNode) )
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = doublecircle" );
            }
            else if ( Gia_ObjIsMux(p, pNode) )
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = trapezium" );
            }
            else
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = ellipse" );
            }
            if ( pNode->fMark0 )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate constant node
    if ( fConstIsUsed )
    {
        // check if the costant node is present
        fprintf( pFile, "  Node%d [label = \"Const0\"", 0 );
        fprintf( pFile, ", shape = ellipse" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    // generate the CI nodes
    Gia_ManForEachCi( p, pNode, i )
    {
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "triangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Gia_ManForEachCo( p, pNode, i )
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", Gia_ObjId(p, pNode) );
    // generate invisible edges among the COs
    Prev = -1;
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }
    // generate invisible edges among the CIs
    Prev = -1;
    Gia_ManForEachCi( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }

    // generate edges
    Gia_ManForEachCo( p, pNode, i )
    {
        int iNode = Gia_ObjId( p, pNode );
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId0(pNode, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC0(pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
    }
    Gia_ManForEachObjVec( vOrder, p, pNode, i )
    {
        int iNode = Gia_ObjId( p, pNode );
        if ( Vec_IntEntry(vMapAdds, Gia_ObjId(p, pNode)) >= 0 )
        {
            int k, iBox = Vec_IntEntry(vMapAdds, iNode);
            for ( k = 0; k < 3; k++ )
                if ( Vec_IntEntry(vAdds, 6*iBox+k) )
                {
                    int iBox2 = Vec_IntEntry(vMapAdds, Vec_IntEntry(vAdds, 6*iBox+k));
                    int fXor2 = iBox2 >= 0 ? (int)(Vec_IntEntry(vAdds, 6*iBox2+3) == Vec_IntEntry(vAdds, 6*iBox+k)) : 0;
                    fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, iNode) );
                    fprintf( pFile, " -> " );
                    fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Vec_IntEntry(vAdds, 6*iBox+k)) );
                    fprintf( pFile, " [" );
                    fprintf( pFile, "style = %s", fXor2? "bold" : "solid" );
                    fprintf( pFile, "]" );
                    fprintf( pFile, ";\n" );
                }
            continue;
        }
        if ( Vec_IntEntry(vMapXors, Gia_ObjId(p, pNode)) >= 0 )
        {
            int k, iXor = Vec_IntEntry(vMapXors, iNode);
            for ( k = 1; k < 4; k++ )
                if ( Vec_IntEntry(vXors, 4*iXor+k) )
                {
                    int iXor2 = Vec_IntEntry(vMapXors, Vec_IntEntry(vXors, 4*iXor+k));
                    fprintf( pFile, "Node%d",  iNode );
                    fprintf( pFile, " -> " );
                    fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Vec_IntEntry(vXors, 4*iXor+k)) );
                    fprintf( pFile, " [" );
                    fprintf( pFile, "style = %s", iXor2 >= 0? "bold" : "solid" );
                    fprintf( pFile, "]" );
                    fprintf( pFile, ";\n" );
                }
            continue;
        }
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId0(pNode, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC0(pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
        if ( !Gia_ObjIsAnd(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId1(pNode, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC1(pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );

        if ( !Gia_ObjIsMux(p, pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId2(p, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC2(p, pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 0;

    Vec_IntFreeP( &p->vLevels );
}